

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O3

ReaderInitializeType __thiscall
duckdb::MultiFileColumnMapper::CreateMapping(MultiFileColumnMapper *this)

{
  undefined1 auVar1 [8];
  ReaderInitializeType RVar2;
  BaseFileReader *pBVar3;
  pointer *__ptr;
  ReaderInitializeType RVar4;
  map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
  remaining_filters;
  ResultColumnMapping result;
  undefined1 local_a8 [8];
  undefined1 local_a0 [16];
  __node_base local_90;
  _Base_ptr local_88;
  optional_ptr<duckdb::TableFilterSet,_true> local_80;
  OpenFileInfo *local_78;
  ResultColumnMapping local_70;
  
  CreateColumnMapping(&local_70,this);
  local_88 = (_Base_ptr)(local_a0 + 8);
  local_a0._8_4_ = _S_red;
  local_90._M_nxt = (_Hash_node_base *)0x0;
  local_78 = (OpenFileInfo *)0x0;
  local_80.ptr = (TableFilterSet *)local_88;
  RVar2 = EvaluateConstantFilters
                    (this,&local_70,
                     (map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
                      *)local_a0);
  RVar4 = SKIP_READING_FILE;
  if (RVar2 != SKIP_READING_FILE) {
    CreateFilters((MultiFileColumnMapper *)local_a8,
                  (map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
                   *)this,(ResultColumnMapping *)local_a0);
    pBVar3 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&this->reader_data->reader);
    auVar1 = local_a8;
    local_a8 = (undefined1  [8])0x0;
    ::std::__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>::
    reset((__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> *)
          &pBVar3->filters,(pointer)auVar1);
    auVar1 = local_a8;
    if (local_a8 != (undefined1  [8])0x0) {
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
                   *)local_a8);
      operator_delete((void *)auVar1);
    }
    RVar4 = INITIALIZED;
  }
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
               *)local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.error._M_dataplus._M_p != &local_70.error.field_2) {
    operator_delete(local_70.error._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_70);
  return RVar4;
}

Assistant:

ReaderInitializeType MultiFileColumnMapper::CreateMapping() {
	// copy global columns and inject any different defaults
	auto result = CreateColumnMapping();
	//! Evaluate the filters against the column(s) that are constant for this file (not present in the local schema)
	//! If any of these fail, the file can be skipped entirely
	map<idx_t, reference<TableFilter>> remaining_filters;
	auto evaluate_result = EvaluateConstantFilters(result, remaining_filters);
	if (evaluate_result == ReaderInitializeType::SKIP_READING_FILE) {
		return ReaderInitializeType::SKIP_READING_FILE;
	}

	reader_data.reader->filters = CreateFilters(remaining_filters, result);

	// for any remaining casts - push them as expressions
	return ReaderInitializeType::INITIALIZED;
}